

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O2

void __thiscall rcg::CPort::Read(CPort *this,void *buffer,int64_t addr,int64_t length)

{
  int iVar1;
  ostream *poVar2;
  GenTLException *pGVar3;
  bool bVar4;
  size_t local_1d0;
  string local_1c8;
  ostringstream out;
  
  local_1d0 = 0;
  if (*this->port == (void *)0x0) {
    pGVar3 = (GenTLException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&out,"CPort::Read(): Port has been closed",(allocator *)&local_1c8);
    GenTLException::GenTLException(pGVar3,(string *)&out);
    __cxa_throw(pGVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  iVar1 = -0x3e9;
  bVar4 = true;
  while ((bVar4 && (iVar1 != 0))) {
    local_1d0 = length;
    iVar1 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->GCReadPort)(*this->port,addr,buffer,&local_1d0);
    bVar4 = false;
  }
  if (iVar1 == 0) {
    if (local_1d0 != 0) {
      for (; local_1d0 < (ulong)length; local_1d0 = local_1d0 + 1) {
        *(undefined1 *)((long)buffer + local_1d0) = 0;
      }
      return;
    }
    pGVar3 = (GenTLException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&out,"CPort::Read(): Returned size is 0",(allocator *)&local_1c8);
    GenTLException::GenTLException(pGVar3,(string *)&out);
    __cxa_throw(pGVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  poVar2 = std::operator<<((ostream *)&out,"CPort::Read(address=0x");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2,", length=");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,")");
  pGVar3 = (GenTLException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  GenTLException::GenTLException(pGVar3,&local_1c8,&this->gentl);
  __cxa_throw(pGVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

void CPort::Read(void *buffer, int64_t addr, int64_t length)
{
  size_t size=0;

  if (*port != 0)
  {
    int retry=1;
    GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

    while (err != GenTL::GC_ERR_SUCCESS && retry > 0)
    {
      retry--;

      size=static_cast<size_t>(length);
      err=gentl->GCReadPort(*port, static_cast<uint64_t>(addr), buffer, &size);
    }

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      std::ostringstream out;
      out << "CPort::Read(address=0x" << std::hex << addr << ", length=" <<
        std::dec << static_cast<size_t>(length) << ")";

      throw GenTLException(out.str(), gentl);
    }

    if (size == 0)
    {
      throw GenTLException("CPort::Read(): Returned size is 0");
    }

    while (size < static_cast<size_t>(length))
    {
      reinterpret_cast<uint8_t *>(buffer)[size++]=0;
    }
  }
  else
  {
    throw GenTLException("CPort::Read(): Port has been closed");
  }
}